

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  undefined4 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  float **ppfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  Geometry *pGVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar26;
  int iVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar30;
  long lVar31;
  RTCRayN *pRVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  Scene *pSVar38;
  uint *puVar39;
  long lVar40;
  ulong uVar41;
  float fVar42;
  float fVar43;
  float fVar75;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar78;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar64;
  float fVar76;
  float fVar77;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar74;
  float fVar79;
  float fVar95;
  float fVar97;
  float fVar98;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  uint uVar80;
  uint uVar96;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  float fVar116;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar117;
  float fVar123;
  float fVar124;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar125;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar138;
  float fVar142;
  float fVar144;
  float fVar145;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar143;
  undefined1 auVar141 [16];
  float fVar146;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar154 [16];
  float fVar158;
  float fVar161;
  float fVar162;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar163;
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar165 [16];
  float fVar170;
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar172 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar183;
  float fVar185;
  float fVar186;
  undefined1 auVar181 [16];
  float fVar184;
  undefined1 auVar182 [16];
  float local_1468;
  float fStack_1464;
  float fStack_1460;
  float fStack_145c;
  float fStack_1454;
  vbool<4> valid;
  float fStack_1420;
  float fStack_141c;
  float local_1408;
  float fStack_1404;
  undefined1 local_13d8 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  float fStack_1350;
  float fStack_134c;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  vfloat<4> tNear;
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  undefined8 local_11e8;
  float fStack_11e0;
  float fStack_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  long local_11b0;
  long local_11a8;
  ulong local_11a0;
  undefined1 local_1198 [16];
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined4 local_1148;
  undefined4 uStack_1144;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  undefined4 local_1138;
  undefined4 uStack_1134;
  undefined4 uStack_1130;
  undefined4 uStack_112c;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  uint local_1108;
  uint uStack_1104;
  uint uStack_1100;
  uint uStack_10fc;
  uint local_10f8;
  uint uStack_10f4;
  uint uStack_10f0;
  uint uStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [16];
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar30 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar78 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar105 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar116 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar158 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar163 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar170 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar178 = fVar158 * 0.99999964;
  fVar135 = fVar163 * 0.99999964;
  fVar176 = fVar170 * 0.99999964;
  fVar158 = fVar158 * 1.0000004;
  fVar163 = fVar163 * 1.0000004;
  fVar170 = fVar170 * 1.0000004;
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_11a0 = uVar37 ^ 0x10;
  iVar27 = (tray->tnear).field_0.i[k];
  auVar54._4_4_ = iVar27;
  auVar54._0_4_ = iVar27;
  auVar54._8_4_ = iVar27;
  auVar54._12_4_ = iVar27;
  iVar27 = (tray->tfar).field_0.i[k];
  auVar130._4_4_ = iVar27;
  auVar130._0_4_ = iVar27;
  auVar130._8_4_ = iVar27;
  auVar130._12_4_ = iVar27;
  local_1058 = mm_lookupmask_ps._0_8_;
  uStack_1050 = mm_lookupmask_ps._8_8_;
  local_1068 = mm_lookupmask_ps._240_8_;
  uStack_1060 = mm_lookupmask_ps._248_8_;
  local_1078 = fVar78;
  fStack_1074 = fVar78;
  fStack_1070 = fVar78;
  fStack_106c = fVar78;
  local_1088 = fVar105;
  fStack_1084 = fVar105;
  fStack_1080 = fVar105;
  fStack_107c = fVar105;
  local_1098 = fVar116;
  fStack_1094 = fVar116;
  fStack_1090 = fVar116;
  fStack_108c = fVar116;
  local_10a8 = fVar158;
  fStack_10a4 = fVar158;
  fStack_10a0 = fVar158;
  fStack_109c = fVar158;
  local_10b8 = fVar163;
  fStack_10b4 = fVar163;
  fStack_10b0 = fVar163;
  fStack_10ac = fVar163;
  local_10c8 = fVar170;
  fStack_10c4 = fVar170;
  fStack_10c0 = fVar170;
  fStack_10bc = fVar170;
  local_10d8 = fVar176;
  fStack_10d4 = fVar176;
  fStack_10d0 = fVar176;
  fStack_10cc = fVar176;
  local_10e8 = fVar178;
  fStack_10e4 = fVar178;
  fStack_10e0 = fVar178;
  fStack_10dc = fVar178;
  local_1188 = fVar135;
  fStack_1184 = fVar135;
  fStack_1180 = fVar135;
  fStack_117c = fVar135;
  local_1198 = auVar54;
  fVar143 = fVar135;
  fVar155 = fVar135;
  fVar43 = fVar135;
  fVar153 = fVar178;
  fVar152 = fVar178;
  fVar151 = fVar178;
  fVar146 = fVar170;
  fVar138 = fVar170;
  fVar145 = fVar170;
  fVar144 = fVar163;
  fVar142 = fVar163;
  fVar125 = fVar163;
  fVar124 = fVar158;
  fVar123 = fVar158;
  fVar117 = fVar158;
  fVar162 = fVar116;
  fVar161 = fVar116;
  fVar98 = fVar116;
  fVar97 = fVar78;
  fVar95 = fVar78;
  fVar79 = fVar78;
  fVar75 = fVar176;
  fVar42 = fVar176;
  fVar77 = fVar176;
  fVar157 = fVar105;
  fVar76 = fVar105;
  fVar156 = fVar105;
LAB_00279d45:
  do {
    pSVar26 = pSVar30 + -1;
    pSVar30 = pSVar30 + -1;
    if ((float)pSVar26->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar26->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar35 = (pSVar30->ptr).ptr;
      while ((uVar35 & 8) == 0) {
        pfVar9 = (float *)(uVar35 + 0x20 + uVar37);
        auVar44._0_4_ = (*pfVar9 - fVar79) * fVar151;
        auVar44._4_4_ = (pfVar9[1] - fVar95) * fVar152;
        auVar44._8_4_ = (pfVar9[2] - fVar97) * fVar153;
        auVar44._12_4_ = (pfVar9[3] - fVar78) * fVar178;
        pfVar9 = (float *)(uVar35 + 0x20 + uVar36);
        auVar127._0_4_ = (*pfVar9 - fVar156) * fVar135;
        auVar127._4_4_ = (pfVar9[1] - fVar76) * fVar143;
        auVar127._8_4_ = (pfVar9[2] - fVar157) * fVar155;
        auVar127._12_4_ = (pfVar9[3] - fVar105) * fVar43;
        auVar44 = maxps(auVar44,auVar127);
        pfVar9 = (float *)(uVar35 + 0x20 + uVar41);
        auVar137._0_4_ = (*pfVar9 - fVar98) * fVar77;
        auVar137._4_4_ = (pfVar9[1] - fVar161) * fVar42;
        auVar137._8_4_ = (pfVar9[2] - fVar162) * fVar75;
        auVar137._12_4_ = (pfVar9[3] - fVar116) * fVar176;
        auVar99 = maxps(auVar137,auVar54);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar44,auVar99);
        pfVar9 = (float *)(uVar35 + 0x20 + local_11a0);
        auVar100._0_4_ = (*pfVar9 - fVar79) * fVar117;
        auVar100._4_4_ = (pfVar9[1] - fVar95) * fVar123;
        auVar100._8_4_ = (pfVar9[2] - fVar97) * fVar124;
        auVar100._12_4_ = (pfVar9[3] - fVar78) * fVar158;
        pfVar9 = (float *)(uVar35 + 0x20 + (uVar36 ^ 0x10));
        auVar106._0_4_ = (*pfVar9 - fVar156) * fVar125;
        auVar106._4_4_ = (pfVar9[1] - fVar76) * fVar142;
        auVar106._8_4_ = (pfVar9[2] - fVar157) * fVar144;
        auVar106._12_4_ = (pfVar9[3] - fVar105) * fVar163;
        auVar44 = minps(auVar100,auVar106);
        pfVar9 = (float *)(uVar35 + 0x20 + (uVar41 ^ 0x10));
        auVar107._0_4_ = (*pfVar9 - fVar98) * fVar145;
        auVar107._4_4_ = (pfVar9[1] - fVar161) * fVar138;
        auVar107._8_4_ = (pfVar9[2] - fVar162) * fVar146;
        auVar107._12_4_ = (pfVar9[3] - fVar116) * fVar170;
        auVar99 = minps(auVar107,auVar130);
        auVar44 = minps(auVar44,auVar99);
        auVar99._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar44._4_4_);
        auVar99._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar44._0_4_);
        auVar99._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar44._8_4_);
        auVar99._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar44._12_4_);
        uVar34 = movmskps((int)local_11a0,auVar99);
        if (uVar34 == 0) {
          if (pSVar30 == stack) {
            return;
          }
          goto LAB_00279d45;
        }
        uVar34 = uVar34 & 0xff;
        uVar33 = uVar35 & 0xfffffffffffffff0;
        lVar31 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
          }
        }
        uVar35 = *(ulong *)(uVar33 + lVar31 * 8);
        uVar34 = uVar34 - 1 & uVar34;
        if (uVar34 != 0) {
          uVar80 = tNear.field_0.i[lVar31];
          lVar31 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
            }
          }
          uVar11 = *(ulong *)(uVar33 + lVar31 * 8);
          uVar96 = tNear.field_0.i[lVar31];
          uVar34 = uVar34 - 1 & uVar34;
          if (uVar34 == 0) {
            if (uVar80 < uVar96) {
              (pSVar30->ptr).ptr = uVar11;
              pSVar30->dist = uVar96;
              pSVar30 = pSVar30 + 1;
            }
            else {
              (pSVar30->ptr).ptr = uVar35;
              pSVar30->dist = uVar80;
              pSVar30 = pSVar30 + 1;
              uVar35 = uVar11;
            }
          }
          else {
            auVar101._8_4_ = uVar80;
            auVar101._0_8_ = uVar35;
            auVar101._12_4_ = 0;
            auVar118._8_4_ = uVar96;
            auVar118._0_8_ = uVar11;
            auVar118._12_4_ = 0;
            lVar31 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
              }
            }
            uVar12 = *(undefined8 *)(uVar33 + lVar31 * 8);
            iVar27 = tNear.field_0.i[lVar31];
            auVar108._8_4_ = iVar27;
            auVar108._0_8_ = uVar12;
            auVar108._12_4_ = 0;
            auVar45._8_4_ = -(uint)((int)uVar80 < (int)uVar96);
            uVar34 = uVar34 - 1 & uVar34;
            if (uVar34 == 0) {
              auVar45._4_4_ = auVar45._8_4_;
              auVar45._0_4_ = auVar45._8_4_;
              auVar45._12_4_ = auVar45._8_4_;
              auVar126._8_4_ = uVar96;
              auVar126._0_8_ = uVar11;
              auVar126._12_4_ = 0;
              auVar127 = blendvps(auVar126,auVar101,auVar45);
              auVar44 = blendvps(auVar101,auVar118,auVar45);
              auVar46._8_4_ = -(uint)(auVar127._8_4_ < iVar27);
              auVar46._4_4_ = auVar46._8_4_;
              auVar46._0_4_ = auVar46._8_4_;
              auVar46._12_4_ = auVar46._8_4_;
              auVar119._8_4_ = iVar27;
              auVar119._0_8_ = uVar12;
              auVar119._12_4_ = 0;
              auVar99 = blendvps(auVar119,auVar127,auVar46);
              auVar127 = blendvps(auVar127,auVar108,auVar46);
              auVar47._8_4_ = -(uint)(auVar44._8_4_ < auVar127._8_4_);
              auVar47._4_4_ = auVar47._8_4_;
              auVar47._0_4_ = auVar47._8_4_;
              auVar47._12_4_ = auVar47._8_4_;
              SVar109 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar127,auVar44,auVar47);
              SVar102 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar44,auVar127,auVar47);
              *pSVar30 = SVar102;
              pSVar30[1] = SVar109;
              uVar35 = auVar99._0_8_;
              pSVar30 = pSVar30 + 2;
            }
            else {
              lVar31 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                }
              }
              auVar48._4_4_ = auVar45._8_4_;
              auVar48._0_4_ = auVar45._8_4_;
              auVar48._8_4_ = auVar45._8_4_;
              auVar48._12_4_ = auVar45._8_4_;
              auVar127 = blendvps(auVar118,auVar101,auVar48);
              auVar54 = blendvps(auVar101,auVar118,auVar48);
              auVar136._8_4_ = tNear.field_0.i[lVar31];
              auVar136._0_8_ = *(undefined8 *)(uVar33 + lVar31 * 8);
              auVar136._12_4_ = 0;
              auVar49._8_4_ = -(uint)(iVar27 < tNear.field_0.i[lVar31]);
              auVar49._4_4_ = auVar49._8_4_;
              auVar49._0_4_ = auVar49._8_4_;
              auVar49._12_4_ = auVar49._8_4_;
              auVar99 = blendvps(auVar136,auVar108,auVar49);
              auVar44 = blendvps(auVar108,auVar136,auVar49);
              auVar50._8_4_ = -(uint)(auVar54._8_4_ < auVar44._8_4_);
              auVar50._4_4_ = auVar50._8_4_;
              auVar50._0_4_ = auVar50._8_4_;
              auVar50._12_4_ = auVar50._8_4_;
              auVar137 = blendvps(auVar44,auVar54,auVar50);
              SVar102 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar54,auVar44,auVar50);
              auVar51._8_4_ = -(uint)(auVar127._8_4_ < auVar99._8_4_);
              auVar51._4_4_ = auVar51._8_4_;
              auVar51._0_4_ = auVar51._8_4_;
              auVar51._12_4_ = auVar51._8_4_;
              auVar54 = blendvps(auVar99,auVar127,auVar51);
              auVar44 = blendvps(auVar127,auVar99,auVar51);
              auVar52._8_4_ = -(uint)(auVar44._8_4_ < auVar137._8_4_);
              auVar52._4_4_ = auVar52._8_4_;
              auVar52._0_4_ = auVar52._8_4_;
              auVar52._12_4_ = auVar52._8_4_;
              SVar109 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar137,auVar44,auVar52);
              SVar128 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar44,auVar137,auVar52);
              *pSVar30 = SVar102;
              pSVar30[1] = SVar128;
              pSVar30[2] = SVar109;
              uVar35 = auVar54._0_8_;
              pSVar30 = pSVar30 + 3;
              auVar54 = local_1198;
              fVar135 = local_1188;
              fVar143 = fStack_1184;
              fVar155 = fStack_1180;
              fVar43 = fStack_117c;
            }
          }
        }
      }
      local_11b0 = (ulong)((uint)uVar35 & 0xf) - 8;
      if (local_11b0 != 0) {
        local_11a8 = 0;
        do {
          pSVar38 = context->scene;
          puVar1 = (uint *)((uVar35 & 0xfffffffffffffff0) + local_11a8 * 0x60);
          puVar39 = puVar1 + 0x10;
          ppfVar13 = (pSVar38->vertices).items;
          pfVar14 = ppfVar13[*puVar39];
          pfVar9 = pfVar14 + *puVar1;
          uVar12 = *(undefined8 *)(pfVar14 + puVar1[4]);
          fVar163 = pfVar14[puVar1[8]];
          fVar170 = (pfVar14 + puVar1[8])[1];
          pfVar2 = pfVar14 + puVar1[0xc];
          pfVar15 = ppfVar13[puVar1[0x11]];
          pfVar3 = pfVar15 + puVar1[1];
          pfVar4 = pfVar15 + puVar1[5];
          fVar135 = pfVar4[2];
          fVar143 = pfVar15[puVar1[9]];
          fVar155 = (pfVar15 + puVar1[9])[1];
          pfVar15 = pfVar15 + puVar1[0xd];
          pfVar16 = ppfVar13[puVar1[0x12]];
          pfVar5 = pfVar16 + puVar1[6];
          fVar43 = pfVar5[2];
          fVar156 = pfVar16[(ulong)puVar1[10] + 1];
          pfVar6 = pfVar16 + puVar1[0xe];
          pfVar17 = ppfVar13[puVar1[0x13]];
          pfVar7 = pfVar17 + puVar1[7];
          fVar76 = pfVar7[2];
          fVar157 = pfVar17[(ulong)puVar1[0xb] + 1];
          pfVar8 = pfVar17 + puVar1[0xf];
          local_1408 = (float)uVar12;
          fStack_1404 = (float)((ulong)uVar12 >> 0x20);
          fVar77 = (float)*(undefined8 *)(pfVar14 + puVar1[4] + 2);
          fStack_11b8 = pfVar16[(ulong)puVar1[10] + 2];
          fStack_11b4 = pfVar17[(ulong)puVar1[0xb] + 2];
          fVar78 = *(float *)(ray + k * 4);
          local_11f8 = *(float *)(ray + k * 4 + 0x10);
          fVar79 = *pfVar9 - fVar78;
          fVar95 = *pfVar3 - fVar78;
          fVar97 = fStack_1420 - fVar78;
          fVar98 = fStack_141c - fVar78;
          local_11c8 = *pfVar5;
          fStack_11c4 = *pfVar7;
          local_1408 = local_1408 - fVar78;
          fVar142 = *pfVar4 - fVar78;
          fVar144 = *pfVar5 - fVar78;
          fVar145 = *pfVar7 - fVar78;
          local_11e8 = CONCAT44(*pfVar15,*pfVar2);
          local_11d8 = *pfVar6;
          fStack_11d4 = *pfVar8;
          fVar42 = *pfVar2 - fVar78;
          fVar75 = *pfVar15 - fVar78;
          fVar176 = *pfVar6 - fVar78;
          fVar78 = *pfVar8 - fVar78;
          fVar105 = *(float *)(ray + k * 4 + 0x20);
          local_f88 = pfVar9[1] - local_11f8;
          fStack_f84 = pfVar3[1] - local_11f8;
          fStack_f80 = pfVar16[(ulong)puVar1[2] + 1] - local_11f8;
          fStack_f7c = pfVar17[(ulong)puVar1[3] + 1] - local_11f8;
          fVar146 = pfVar9[2] - fVar105;
          fVar151 = pfVar3[2] - fVar105;
          fVar152 = pfVar16[(ulong)puVar1[2] + 2] - fVar105;
          fVar153 = pfVar17[(ulong)puVar1[3] + 2] - fVar105;
          local_1018 = pfVar2[1];
          fStack_1014 = pfVar15[1];
          fStack_1010 = pfVar6[1];
          fStack_100c = pfVar8[1];
          local_1378 = pfVar2[1] - local_11f8;
          fStack_1374 = pfVar15[1] - local_11f8;
          fStack_1370 = pfVar6[1] - local_11f8;
          fStack_136c = pfVar8[1] - local_11f8;
          local_ff8 = pfVar2[2];
          fStack_ff4 = pfVar15[2];
          fStack_ff0 = pfVar6[2];
          fStack_fec = pfVar8[2];
          local_1368 = pfVar2[2] - fVar105;
          fStack_1364 = pfVar15[2] - fVar105;
          fStack_1360 = pfVar6[2] - fVar105;
          fStack_135c = pfVar8[2] - fVar105;
          local_f98 = fVar42 - fVar79;
          fStack_f94 = fVar75 - fVar95;
          fStack_f90 = fVar176 - fVar97;
          fStack_f8c = fVar78 - fVar98;
          local_fb8 = local_1378 - local_f88;
          fStack_fb4 = fStack_1374 - fStack_f84;
          fStack_fb0 = fStack_1370 - fStack_f80;
          fStack_fac = fStack_136c - fStack_f7c;
          local_fa8 = local_1368 - fVar146;
          fStack_fa4 = fStack_1364 - fVar151;
          fStack_fa0 = fStack_1360 - fVar152;
          fStack_f9c = fStack_135c - fVar153;
          fStack_1464 = *(float *)(ray + k * 4 + 0x50);
          local_1468 = fStack_1464;
          fStack_1460 = fStack_1464;
          fStack_145c = fStack_1464;
          fStack_1454 = *(float *)(ray + k * 4 + 0x60);
          fVar116 = *(float *)(ray + k * 4 + 0x40);
          local_1028 = (local_fb8 * (local_1368 + fVar146) - (local_1378 + local_f88) * local_fa8) *
                       fVar116 + ((fVar42 + fVar79) * local_fa8 - (local_1368 + fVar146) * local_f98
                                 ) * fStack_1464 +
                                 (local_f98 * (local_1378 + local_f88) -
                                 (fVar42 + fVar79) * local_fb8) * fStack_1454;
          fStack_1024 = (fStack_fb4 * (fStack_1364 + fVar151) -
                        (fStack_1374 + fStack_f84) * fStack_fa4) * fVar116 +
                        ((fVar75 + fVar95) * fStack_fa4 - (fStack_1364 + fVar151) * fStack_f94) *
                        fStack_1464 +
                        (fStack_f94 * (fStack_1374 + fStack_f84) - (fVar75 + fVar95) * fStack_fb4) *
                        fStack_1454;
          fStack_1020 = (fStack_fb0 * (fStack_1360 + fVar152) -
                        (fStack_1370 + fStack_f80) * fStack_fa0) * fVar116 +
                        ((fVar176 + fVar97) * fStack_fa0 - (fStack_1360 + fVar152) * fStack_f90) *
                        fStack_1464 +
                        (fStack_f90 * (fStack_1370 + fStack_f80) - (fVar176 + fVar97) * fStack_fb0)
                        * fStack_1454;
          fStack_101c = (fStack_fac * (fStack_135c + fVar153) -
                        (fStack_136c + fStack_f7c) * fStack_f9c) * fVar116 +
                        ((fVar78 + fVar98) * fStack_f9c - (fStack_135c + fVar153) * fStack_f8c) *
                        fStack_1464 +
                        (fStack_f8c * (fStack_136c + fStack_f7c) - (fVar78 + fVar98) * fStack_fac) *
                        fStack_1454;
          local_1008 = fStack_1404;
          fStack_1004 = pfVar4[1];
          fStack_1000 = pfVar5[1];
          fStack_ffc = pfVar7[1];
          fStack_11f4 = local_11f8;
          fStack_11f0 = local_11f8;
          fStack_11ec = local_11f8;
          fStack_1404 = fStack_1404 - local_11f8;
          fVar161 = pfVar4[1] - local_11f8;
          fVar162 = pfVar5[1] - local_11f8;
          fVar158 = pfVar7[1] - local_11f8;
          local_1208 = fVar105;
          fStack_1204 = fVar105;
          fStack_1200 = fVar105;
          fStack_11fc = fVar105;
          local_1338 = fVar77 - fVar105;
          fStack_1334 = fVar135 - fVar105;
          fStack_1330 = fVar43 - fVar105;
          fStack_132c = fVar76 - fVar105;
          fVar171 = fVar79 - local_1408;
          fVar173 = fVar95 - fVar142;
          fVar174 = fVar97 - fVar144;
          fVar175 = fVar98 - fVar145;
          fVar178 = local_f88 - fStack_1404;
          fVar166 = fStack_f84 - fVar161;
          fVar168 = fStack_f80 - fVar162;
          fVar169 = fStack_f7c - fVar158;
          local_fc8 = fVar146 - local_1338;
          fStack_fc4 = fVar151 - fStack_1334;
          fStack_fc0 = fVar152 - fStack_1330;
          fStack_fbc = fVar153 - fStack_132c;
          auVar147._0_4_ =
               (fVar178 * (fVar146 + local_1338) - (local_f88 + fStack_1404) * local_fc8) * fVar116
               + ((fVar79 + local_1408) * local_fc8 - (fVar146 + local_1338) * fVar171) *
                 fStack_1464 +
                 (fVar171 * (local_f88 + fStack_1404) - (fVar79 + local_1408) * fVar178) *
                 fStack_1454;
          auVar147._4_4_ =
               (fVar166 * (fVar151 + fStack_1334) - (fStack_f84 + fVar161) * fStack_fc4) * fVar116 +
               ((fVar95 + fVar142) * fStack_fc4 - (fVar151 + fStack_1334) * fVar173) * fStack_1464 +
               (fVar173 * (fStack_f84 + fVar161) - (fVar95 + fVar142) * fVar166) * fStack_1454;
          auVar147._8_4_ =
               (fVar168 * (fVar152 + fStack_1330) - (fStack_f80 + fVar162) * fStack_fc0) * fVar116 +
               ((fVar97 + fVar144) * fStack_fc0 - (fVar152 + fStack_1330) * fVar174) * fStack_1464 +
               (fVar174 * (fStack_f80 + fVar162) - (fVar97 + fVar144) * fVar168) * fStack_1454;
          auVar147._12_4_ =
               (fVar169 * (fVar153 + fStack_132c) - (fStack_f7c + fVar158) * fStack_fbc) * fVar116 +
               ((fVar98 + fVar145) * fStack_fbc - (fVar153 + fStack_132c) * fVar175) * fStack_1464 +
               (fVar175 * (fStack_f7c + fVar158) - (fVar98 + fVar145) * fVar169) * fStack_1454;
          fVar179 = local_1408 - fVar42;
          fVar183 = fVar142 - fVar75;
          fVar185 = fVar144 - fVar176;
          fVar186 = fVar145 - fVar78;
          fVar117 = fStack_1404 - local_1378;
          fVar123 = fVar161 - fStack_1374;
          fVar124 = fVar162 - fStack_1370;
          fVar125 = fVar158 - fStack_136c;
          local_fd8 = local_1338 - local_1368;
          fStack_fd4 = fStack_1334 - fStack_1364;
          fStack_fd0 = fStack_1330 - fStack_1360;
          fStack_fcc = fStack_132c - fStack_135c;
          local_1218 = fStack_1404;
          fStack_1214 = fVar161;
          fStack_1210 = fVar162;
          fStack_120c = fVar158;
          local_1328 = fStack_1404 + local_1378;
          fStack_1324 = fVar161 + fStack_1374;
          fStack_1320 = fVar162 + fStack_1370;
          fStack_131c = fVar158 + fStack_136c;
          local_1318 = local_1338 + local_1368;
          fStack_1314 = fStack_1334 + fStack_1364;
          fStack_1310 = fStack_1330 + fStack_1360;
          fStack_130c = fStack_132c + fStack_135c;
          auVar81._0_4_ =
               (fVar117 * local_1318 - local_1328 * local_fd8) * fVar116 +
               ((fVar42 + local_1408) * local_fd8 - fVar179 * local_1318) * fStack_1464 +
               (fVar179 * local_1328 - (fVar42 + local_1408) * fVar117) * fStack_1454;
          auVar81._4_4_ =
               (fVar123 * fStack_1314 - fStack_1324 * fStack_fd4) * fVar116 +
               ((fVar75 + fVar142) * fStack_fd4 - fVar183 * fStack_1314) * fStack_1464 +
               (fVar183 * fStack_1324 - (fVar75 + fVar142) * fVar123) * fStack_1454;
          auVar81._8_4_ =
               (fVar124 * fStack_1310 - fStack_1320 * fStack_fd0) * fVar116 +
               ((fVar176 + fVar144) * fStack_fd0 - fVar185 * fStack_1310) * fStack_1464 +
               (fVar185 * fStack_1320 - (fVar176 + fVar144) * fVar124) * fStack_1454;
          auVar81._12_4_ =
               (fVar125 * fStack_130c - fStack_131c * fStack_fcc) * fVar116 +
               ((fVar78 + fVar145) * fStack_fcc - fVar186 * fStack_130c) * fStack_1464 +
               (fVar186 * fStack_131c - (fVar78 + fVar145) * fVar125) * fStack_1454;
          fVar142 = local_1028 + auVar147._0_4_ + auVar81._0_4_;
          fVar144 = fStack_1024 + auVar147._4_4_ + auVar81._4_4_;
          fVar145 = fStack_1020 + auVar147._8_4_ + auVar81._8_4_;
          fVar138 = fStack_101c + auVar147._12_4_ + auVar81._12_4_;
          auVar53._4_4_ = fStack_1024;
          auVar53._0_4_ = local_1028;
          auVar53._8_4_ = fStack_1020;
          auVar53._12_4_ = fStack_101c;
          auVar54 = minps(auVar53,auVar147);
          auVar54 = minps(auVar54,auVar81);
          auVar129._4_4_ = fStack_1024;
          auVar129._0_4_ = local_1028;
          auVar129._8_4_ = fStack_1020;
          auVar129._12_4_ = fStack_101c;
          auVar130 = maxps(auVar129,auVar147);
          auVar130 = maxps(auVar130,auVar81);
          fVar78 = ABS(fVar142) * 1.1920929e-07;
          fVar42 = ABS(fVar144) * 1.1920929e-07;
          fVar75 = ABS(fVar145) * 1.1920929e-07;
          fVar176 = ABS(fVar138) * 1.1920929e-07;
          auVar131._4_4_ = -(uint)(auVar130._4_4_ <= fVar42);
          auVar131._0_4_ = -(uint)(auVar130._0_4_ <= fVar78);
          auVar131._8_4_ = -(uint)(auVar130._8_4_ <= fVar75);
          auVar131._12_4_ = -(uint)(auVar130._12_4_ <= fVar176);
          auVar55._4_4_ = -(uint)(-fVar42 <= auVar54._4_4_);
          auVar55._0_4_ = -(uint)(-fVar78 <= auVar54._0_4_);
          auVar55._8_4_ = -(uint)(-fVar75 <= auVar54._8_4_);
          auVar55._12_4_ = -(uint)(-fVar176 <= auVar54._12_4_);
          auVar131 = auVar131 | auVar55;
          lVar31 = local_11a8 * 0x60 + (uVar35 & 0xfffffffffffffff0);
          uVar29 = (undefined4)((ulong)lVar31 >> 0x20);
          iVar27 = movmskps((int)lVar31,auVar131);
          scene = pSVar38;
          if (iVar27 == 0) {
            uVar34 = 0;
LAB_0027b713:
            auVar121._4_4_ = local_11f8;
            auVar121._0_4_ = local_11f8;
            auVar121._8_4_ = local_11f8;
            auVar121._12_4_ = local_11f8;
          }
          else {
            local_1048 = fVar142;
            fStack_1044 = fVar144;
            fStack_1040 = fVar145;
            fStack_103c = fVar138;
            local_1038 = auVar147;
            local_fe8 = fVar117;
            fStack_fe4 = fVar123;
            fStack_fe0 = fVar124;
            fStack_fdc = fVar125;
            auVar165._0_4_ = fVar178 * local_fd8 - fVar117 * local_fc8;
            auVar165._4_4_ = fVar166 * fStack_fd4 - fVar123 * fStack_fc4;
            auVar165._8_4_ = fVar168 * fStack_fd0 - fVar124 * fStack_fc0;
            auVar165._12_4_ = fVar169 * fStack_fcc - fVar125 * fStack_fbc;
            auVar56._4_4_ = -(uint)(ABS(fVar166 * fStack_fa4) < ABS(fVar123 * fStack_fc4));
            auVar56._0_4_ = -(uint)(ABS(fVar178 * local_fa8) < ABS(fVar117 * local_fc8));
            auVar56._8_4_ = -(uint)(ABS(fVar168 * fStack_fa0) < ABS(fVar124 * fStack_fc0));
            auVar56._12_4_ = -(uint)(ABS(fVar169 * fStack_f9c) < ABS(fVar125 * fStack_fbc));
            auVar22._4_4_ = fStack_fb4 * fStack_fc4 - fVar166 * fStack_fa4;
            auVar22._0_4_ = local_fb8 * local_fc8 - fVar178 * local_fa8;
            auVar22._8_4_ = fStack_fb0 * fStack_fc0 - fVar168 * fStack_fa0;
            auVar22._12_4_ = fStack_fac * fStack_fbc - fVar169 * fStack_f9c;
            local_1258 = blendvps(auVar165,auVar22,auVar56);
            auVar159._0_4_ = local_fa8 * fVar171 - local_f98 * local_fc8;
            auVar159._4_4_ = fStack_fa4 * fVar173 - fStack_f94 * fStack_fc4;
            auVar159._8_4_ = fStack_fa0 * fVar174 - fStack_f90 * fStack_fc0;
            auVar159._12_4_ = fStack_f9c * fVar175 - fStack_f8c * fStack_fbc;
            auVar181._0_4_ = fVar179 * local_fc8 - fVar171 * local_fd8;
            auVar181._4_4_ = fVar183 * fStack_fc4 - fVar173 * fStack_fd4;
            auVar181._8_4_ = fVar185 * fStack_fc0 - fVar174 * fStack_fd0;
            auVar181._12_4_ = fVar186 * fStack_fbc - fVar175 * fStack_fcc;
            auVar57._4_4_ = -(uint)(ABS(fStack_f94 * fStack_fc4) < ABS(fVar173 * fStack_fd4));
            auVar57._0_4_ = -(uint)(ABS(local_f98 * local_fc8) < ABS(fVar171 * local_fd8));
            auVar57._8_4_ = -(uint)(ABS(fStack_f90 * fStack_fc0) < ABS(fVar174 * fStack_fd0));
            auVar57._12_4_ = -(uint)(ABS(fStack_f8c * fStack_fbc) < ABS(fVar175 * fStack_fcc));
            local_1248 = blendvps(auVar181,auVar159,auVar57);
            auVar139._0_4_ = local_f98 * fVar178 - fVar171 * local_fb8;
            auVar139._4_4_ = fStack_f94 * fVar166 - fVar173 * fStack_fb4;
            auVar139._8_4_ = fStack_f90 * fVar168 - fVar174 * fStack_fb0;
            auVar139._12_4_ = fStack_f8c * fVar169 - fVar175 * fStack_fac;
            auVar172._0_4_ = fVar171 * fVar117 - fVar179 * fVar178;
            auVar172._4_4_ = fVar173 * fVar123 - fVar183 * fVar166;
            auVar172._8_4_ = fVar174 * fVar124 - fVar185 * fVar168;
            auVar172._12_4_ = fVar175 * fVar125 - fVar186 * fVar169;
            auVar58._4_4_ = -(uint)(ABS(fVar173 * fStack_fb4) < ABS(fVar183 * fVar166));
            auVar58._0_4_ = -(uint)(ABS(fVar171 * local_fb8) < ABS(fVar179 * fVar178));
            auVar58._8_4_ = -(uint)(ABS(fVar174 * fStack_fb0) < ABS(fVar185 * fVar168));
            auVar58._12_4_ = -(uint)(ABS(fVar175 * fStack_fac) < ABS(fVar186 * fVar169));
            local_1238 = blendvps(auVar172,auVar139,auVar58);
            fVar78 = fVar116 * local_1258._0_4_ +
                     fStack_1464 * local_1248._0_4_ + fStack_1454 * local_1238._0_4_;
            fVar42 = fVar116 * local_1258._4_4_ +
                     fStack_1464 * local_1248._4_4_ + fStack_1454 * local_1238._4_4_;
            fVar75 = fVar116 * local_1258._8_4_ +
                     fStack_1464 * local_1248._8_4_ + fStack_1454 * local_1238._8_4_;
            fVar176 = fVar116 * local_1258._12_4_ +
                      fStack_1464 * local_1248._12_4_ + fStack_1454 * local_1238._12_4_;
            auVar59._0_4_ = fVar78 + fVar78;
            auVar59._4_4_ = fVar42 + fVar42;
            auVar59._8_4_ = fVar75 + fVar75;
            auVar59._12_4_ = fVar176 + fVar176;
            auVar82._0_4_ = fVar146 * local_1238._0_4_;
            auVar82._4_4_ = fVar151 * local_1238._4_4_;
            auVar82._8_4_ = fVar152 * local_1238._8_4_;
            auVar82._12_4_ = fVar153 * local_1238._12_4_;
            fVar79 = fVar79 * local_1258._0_4_ + local_f88 * local_1248._0_4_ + auVar82._0_4_;
            fVar95 = fVar95 * local_1258._4_4_ + fStack_f84 * local_1248._4_4_ + auVar82._4_4_;
            fVar97 = fVar97 * local_1258._8_4_ + fStack_f80 * local_1248._8_4_ + auVar82._8_4_;
            fVar98 = fVar98 * local_1258._12_4_ + fStack_f7c * local_1248._12_4_ + auVar82._12_4_;
            auVar54 = rcpps(auVar82,auVar59);
            fVar78 = auVar54._0_4_;
            fVar42 = auVar54._4_4_;
            fVar75 = auVar54._8_4_;
            fVar176 = auVar54._12_4_;
            fVar79 = ((1.0 - auVar59._0_4_ * fVar78) * fVar78 + fVar78) * (fVar79 + fVar79);
            fVar95 = ((1.0 - auVar59._4_4_ * fVar42) * fVar42 + fVar42) * (fVar95 + fVar95);
            fVar75 = ((1.0 - auVar59._8_4_ * fVar75) * fVar75 + fVar75) * (fVar97 + fVar97);
            fVar176 = ((1.0 - auVar59._12_4_ * fVar176) * fVar176 + fVar176) * (fVar98 + fVar98);
            fVar42 = *(float *)(ray + k * 4 + 0x80);
            fVar78 = *(float *)(ray + k * 4 + 0x30);
            auVar83._0_4_ = -(uint)(fVar79 <= fVar42 && fVar78 <= fVar79) & auVar131._0_4_;
            auVar83._4_4_ = -(uint)(fVar95 <= fVar42 && fVar78 <= fVar95) & auVar131._4_4_;
            auVar83._8_4_ = -(uint)(fVar75 <= fVar42 && fVar78 <= fVar75) & auVar131._8_4_;
            auVar83._12_4_ = -(uint)(fVar176 <= fVar42 && fVar78 <= fVar176) & auVar131._12_4_;
            uVar34 = movmskps(iVar27,auVar83);
            if (uVar34 == 0) goto LAB_0027b713;
            uVar80 = auVar83._0_4_ & -(uint)(auVar59._0_4_ != 0.0);
            uVar96 = auVar83._4_4_ & -(uint)(auVar59._4_4_ != 0.0);
            valid.field_0._0_8_ = CONCAT44(uVar96,uVar80);
            valid.field_0.i[2] = auVar83._8_4_ & -(uint)(auVar59._8_4_ != 0.0);
            valid.field_0.i[3] = auVar83._12_4_ & -(uint)(auVar59._12_4_ != 0.0);
            uVar34 = movmskps(uVar34,(undefined1  [16])valid.field_0);
            auVar121._4_4_ = local_11f8;
            auVar121._0_4_ = local_11f8;
            auVar121._8_4_ = local_11f8;
            auVar121._12_4_ = local_11f8;
            if (uVar34 != 0) {
              tNear.field_0.v[1] = fStack_1024;
              tNear.field_0.v[0] = local_1028;
              tNear.field_0.v[2] = fStack_1020;
              tNear.field_0.v[3] = fStack_101c;
              auVar25._4_4_ = fVar144;
              auVar25._0_4_ = fVar142;
              auVar25._8_4_ = fVar145;
              auVar25._12_4_ = fVar138;
              auVar140._4_4_ = fVar95;
              auVar140._0_4_ = fVar79;
              auVar140._8_4_ = fVar75;
              auVar140._12_4_ = fVar176;
              local_1268 = auVar140;
              local_1228._8_8_ = uStack_1050;
              local_1228._0_8_ = local_1058;
              auVar54 = rcpps(auVar121,auVar25);
              fVar105 = auVar54._0_4_;
              fVar116 = auVar54._4_4_;
              fVar158 = auVar54._8_4_;
              fVar97 = auVar54._12_4_;
              fVar98 = (float)DAT_01f7ba10;
              fVar161 = DAT_01f7ba10._4_4_;
              fVar162 = DAT_01f7ba10._12_4_;
              fVar78 = DAT_01f7ba10._8_4_;
              fVar105 = (float)(-(uint)(1e-18 <= ABS(fVar142)) &
                               (uint)((fVar98 - fVar142 * fVar105) * fVar105 + fVar105));
              fVar116 = (float)(-(uint)(1e-18 <= ABS(fVar144)) &
                               (uint)((fVar161 - fVar144 * fVar116) * fVar116 + fVar116));
              fVar158 = (float)(-(uint)(1e-18 <= ABS(fVar145)) &
                               (uint)((fVar78 - fVar145 * fVar158) * fVar158 + fVar158));
              fVar97 = (float)(-(uint)(1e-18 <= ABS(fVar138)) &
                              (uint)((fVar162 - fVar138 * fVar97) * fVar97 + fVar97));
              auVar148._0_4_ = local_1028 * fVar105;
              auVar148._4_4_ = fStack_1024 * fVar116;
              auVar148._8_4_ = fStack_1020 * fVar158;
              auVar148._12_4_ = fStack_101c * fVar97;
              auVar130 = minps(auVar148,_DAT_01f7ba10);
              auVar110._0_4_ = fVar105 * auVar147._0_4_;
              auVar110._4_4_ = fVar116 * auVar147._4_4_;
              auVar110._8_4_ = fVar158 * auVar147._8_4_;
              auVar110._12_4_ = fVar97 * auVar147._12_4_;
              auVar54 = minps(auVar110,_DAT_01f7ba10);
              auVar103._0_4_ = fVar98 - auVar130._0_4_;
              auVar103._4_4_ = fVar161 - auVar130._4_4_;
              auVar103._8_4_ = fVar78 - auVar130._8_4_;
              auVar103._12_4_ = fVar162 - auVar130._12_4_;
              auVar120._0_4_ = fVar98 - auVar54._0_4_;
              auVar120._4_4_ = fVar161 - auVar54._4_4_;
              auVar120._8_4_ = fVar78 - auVar54._8_4_;
              auVar120._12_4_ = fVar162 - auVar54._12_4_;
              local_1288 = blendvps(auVar130,auVar103,local_1228);
              local_1278 = blendvps(auVar54,auVar120,local_1228);
              auVar60._8_4_ = valid.field_0.i[2];
              auVar60._0_8_ = valid.field_0._0_8_;
              auVar60._12_4_ = valid.field_0.i[3];
              auVar130 = blendvps(_DAT_01f7a9f0,auVar140,auVar60);
              auVar111._4_4_ = auVar130._0_4_;
              auVar111._0_4_ = auVar130._4_4_;
              auVar111._8_4_ = auVar130._12_4_;
              auVar111._12_4_ = auVar130._8_4_;
              auVar54 = minps(auVar111,auVar130);
              auVar61._0_8_ = auVar54._8_8_;
              auVar61._8_4_ = auVar54._0_4_;
              auVar61._12_4_ = auVar54._4_4_;
              auVar54 = minps(auVar61,auVar54);
              auVar62._0_8_ =
                   CONCAT44(-(uint)(auVar54._4_4_ == auVar130._4_4_) & uVar96,
                            -(uint)(auVar54._0_4_ == auVar130._0_4_) & uVar80);
              auVar62._8_4_ = -(uint)(auVar54._8_4_ == auVar130._8_4_) & valid.field_0.i[2];
              auVar62._12_4_ = -(uint)(auVar54._12_4_ == auVar130._12_4_) & valid.field_0.i[3];
              iVar27 = movmskps(uVar34,auVar62);
              aVar84 = valid.field_0;
              if (iVar27 != 0) {
                aVar84.i[2] = auVar62._8_4_;
                aVar84._0_8_ = auVar62._0_8_;
                aVar84.i[3] = auVar62._12_4_;
              }
              uVar28 = movmskps(iVar27,(undefined1  [16])aVar84);
              lVar40 = 0;
              if (CONCAT44(uVar29,uVar28) != 0) {
                for (; (CONCAT44(uVar29,uVar28) >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                }
              }
LAB_0027a78f:
              uVar34 = puVar39[lVar40];
              pRVar32 = (RTCRayN *)(ulong)uVar34;
              pGVar18 = (pSVar38->geometries).items[(long)pRVar32].ptr;
              if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar40] = 0.0;
LAB_0027aaeb:
                uVar29 = (undefined4)((ulong)pRVar32 >> 0x20);
                uVar34 = movmskps((int)pRVar32,(undefined1  [16])valid.field_0);
                if (uVar34 == 0) goto LAB_0027ac52;
                auVar130 = blendvps(_DAT_01f7a9f0,auVar140,(undefined1  [16])valid.field_0);
                auVar112._4_4_ = auVar130._0_4_;
                auVar112._0_4_ = auVar130._4_4_;
                auVar112._8_4_ = auVar130._12_4_;
                auVar112._12_4_ = auVar130._8_4_;
                auVar54 = minps(auVar112,auVar130);
                auVar86._0_8_ = auVar54._8_8_;
                auVar86._8_4_ = auVar54._0_4_;
                auVar86._12_4_ = auVar54._4_4_;
                auVar54 = minps(auVar86,auVar54);
                auVar87._0_8_ =
                     CONCAT44(-(uint)(auVar54._4_4_ == auVar130._4_4_) & valid.field_0._4_4_,
                              -(uint)(auVar54._0_4_ == auVar130._0_4_) & valid.field_0._0_4_);
                auVar87._8_4_ = -(uint)(auVar54._8_4_ == auVar130._8_4_) & valid.field_0._8_4_;
                auVar87._12_4_ = -(uint)(auVar54._12_4_ == auVar130._12_4_) & valid.field_0._12_4_;
                iVar27 = movmskps(uVar34,auVar87);
                aVar64 = valid.field_0;
                if (iVar27 != 0) {
                  aVar64.i[2] = auVar87._8_4_;
                  aVar64._0_8_ = auVar87._0_8_;
                  aVar64.i[3] = auVar87._12_4_;
                }
                uVar28 = movmskps(iVar27,(undefined1  [16])aVar64);
                lVar40 = 0;
                if (CONCAT44(uVar29,uVar28) != 0) {
                  for (; (CONCAT44(uVar29,uVar28) >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                  }
                }
                goto LAB_0027a78f;
              }
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar18->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_1148 = *(undefined4 *)(local_1288 + lVar40 * 4);
                local_1138 = *(undefined4 *)(local_1278 + lVar40 * 4);
                local_1178._4_4_ = *(undefined4 *)(local_1258 + lVar40 * 4);
                local_1168._4_4_ = *(undefined4 *)(local_1248 + lVar40 * 4);
                local_1118._4_4_ = uVar34;
                local_1118._0_4_ = uVar34;
                local_1118._8_4_ = uVar34;
                local_1118._12_4_ = uVar34;
                uVar29 = *(undefined4 *)(lVar31 + 0x50 + lVar40 * 4);
                local_1128._4_4_ = uVar29;
                local_1128._0_4_ = uVar29;
                local_1128._8_4_ = uVar29;
                local_1128._12_4_ = uVar29;
                local_1158._4_4_ = *(undefined4 *)(local_1238 + lVar40 * 4);
                local_1178._0_4_ = local_1178._4_4_;
                local_1178._8_4_ = local_1178._4_4_;
                local_1178._12_4_ = local_1178._4_4_;
                local_1168._0_4_ = local_1168._4_4_;
                local_1168._8_4_ = local_1168._4_4_;
                local_1168._12_4_ = local_1168._4_4_;
                local_1158._0_4_ = local_1158._4_4_;
                local_1158._8_4_ = local_1158._4_4_;
                local_1158._12_4_ = local_1158._4_4_;
                uStack_1144 = local_1148;
                uStack_1140 = local_1148;
                uStack_113c = local_1148;
                uStack_1134 = local_1138;
                uStack_1130 = local_1138;
                uStack_112c = local_1138;
                local_1108 = context->user->instID[0];
                uStack_1104 = local_1108;
                uStack_1100 = local_1108;
                uStack_10fc = local_1108;
                local_10f8 = context->user->instPrimID[0];
                uStack_10f4 = local_10f8;
                uStack_10f0 = local_10f8;
                uStack_10ec = local_10f8;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1268 + lVar40 * 4);
                local_13d8 = *(undefined1 (*) [16])
                              (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                args.valid = (int *)local_13d8;
                args.geometryUserPtr = pGVar18->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_1178;
                args.N = 4;
                pRVar32 = (RTCRayN *)pGVar18->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (pRVar32 != (RTCRayN *)0x0) {
                  pRVar32 = (RTCRayN *)(*(code *)pRVar32)(&args);
                  pSVar38 = scene;
                }
                if (local_13d8 == (undefined1  [16])0x0) {
                  auVar85._8_4_ = 0xffffffff;
                  auVar85._0_8_ = 0xffffffffffffffff;
                  auVar85._12_4_ = 0xffffffff;
                  auVar85 = auVar85 ^ _DAT_01f7ae20;
                }
                else {
                  pRVar32 = (RTCRayN *)context->args->filter;
                  if ((pRVar32 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar18->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar32 = (RTCRayN *)(*(code *)pRVar32)(&args);
                    pSVar38 = scene;
                  }
                  auVar63._0_4_ = -(uint)(local_13d8._0_4_ == 0);
                  auVar63._4_4_ = -(uint)(local_13d8._4_4_ == 0);
                  auVar63._8_4_ = -(uint)(local_13d8._8_4_ == 0);
                  auVar63._12_4_ = -(uint)(local_13d8._12_4_ == 0);
                  auVar85 = auVar63 ^ _DAT_01f7ae20;
                  if (local_13d8 != (undefined1  [16])0x0) {
                    auVar54 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar63);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar54;
                    auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar63);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar54;
                    auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar63);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar54;
                    auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar63);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar54;
                    auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar63);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar54;
                    auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar63);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar54;
                    auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar63);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar54;
                    auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar63);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar54;
                    auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar63);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar54;
                    pRVar32 = args.ray;
                  }
                }
                if ((_DAT_01f7bb20 & auVar85) == (undefined1  [16])0x0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar42;
                }
                else {
                  fVar42 = *(float *)(ray + k * 4 + 0x80);
                }
                valid.field_0.v[lVar40] = 0.0;
                valid.field_0.i[0] = -(uint)(auVar140._0_4_ <= fVar42) & valid.field_0.i[0];
                valid.field_0.i[1] = -(uint)(auVar140._4_4_ <= fVar42) & valid.field_0.i[1];
                valid.field_0.i[2] = -(uint)(auVar140._8_4_ <= fVar42) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(auVar140._12_4_ <= fVar42) & valid.field_0.i[3];
                goto LAB_0027aaeb;
              }
              uVar29 = *(undefined4 *)(local_1288 + lVar40 * 4);
              uVar28 = *(undefined4 *)(local_1278 + lVar40 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1268 + lVar40 * 4);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1258 + lVar40 * 4);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1248 + lVar40 * 4);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1238 + lVar40 * 4);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar29;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar28;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar31 + 0x50 + lVar40 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar34;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar34 = context->user->instPrimID[0];
              uVar29 = 0;
              *(uint *)(ray + k * 4 + 0x140) = uVar34;
LAB_0027ac52:
              fVar158 = *(float *)(ray + k * 4 + 0x10);
              fVar105 = *(float *)(ray + k * 4 + 0x20);
              fVar116 = *(float *)(ray + k * 4 + 0x40);
              fStack_1464 = *(float *)(ray + k * 4 + 0x50);
              auVar121._4_4_ = fVar158;
              auVar121._0_4_ = fVar158;
              auVar121._8_4_ = fVar158;
              auVar121._12_4_ = fVar158;
              local_1468 = fStack_1464;
              fStack_1460 = fStack_1464;
              fStack_145c = fStack_1464;
              fStack_1454 = *(float *)(ray + k * 4 + 0x60);
              local_1378 = local_1018 - fVar158;
              fStack_1374 = fStack_1014 - fVar158;
              fStack_1370 = fStack_1010 - fVar158;
              fStack_136c = fStack_100c - fVar158;
              local_1368 = local_ff8 - fVar105;
              fStack_1364 = fStack_ff4 - fVar105;
              fStack_1360 = fStack_ff0 - fVar105;
              fStack_135c = fStack_fec - fVar105;
              fStack_1404 = local_1008 - fVar158;
              fVar161 = fStack_1004 - fVar158;
              fVar162 = fStack_1000 - fVar158;
              fVar158 = fStack_ffc - fVar158;
              local_1338 = fVar77 - fVar105;
              fStack_1334 = fVar135 - fVar105;
              fStack_1330 = fVar43 - fVar105;
              fStack_132c = fVar76 - fVar105;
              fStack_1324 = fStack_1374 + fVar161;
              local_1328 = local_1378 + fStack_1404;
              fStack_1320 = fStack_1370 + fVar162;
              fStack_131c = fStack_136c + fVar158;
              local_1318 = local_1368 + local_1338;
              fStack_1314 = fStack_1364 + fStack_1334;
              fStack_1310 = fStack_1360 + fStack_1330;
              fStack_130c = fStack_135c + fStack_132c;
            }
          }
          local_11c8 = local_11c8 - fVar105;
          fStack_11c4 = fStack_11c4 - fVar105;
          fStack_11c0 = fStack_11c0 - fVar105;
          fStack_11bc = fStack_11bc - fVar105;
          fVar170 = fVar170 - auVar121._0_4_;
          fVar155 = fVar155 - auVar121._4_4_;
          fVar156 = fVar156 - auVar121._8_4_;
          fVar157 = fVar157 - auVar121._12_4_;
          fVar78 = *(float *)(ray + k * 4);
          fVar163 = fVar163 - fVar78;
          fVar143 = fVar143 - fVar78;
          fStack_1350 = fStack_1350 - fVar78;
          fStack_134c = fStack_134c - fVar78;
          fVar183 = (float)local_11e8 - fVar78;
          fVar185 = local_11e8._4_4_ - fVar78;
          fVar186 = fStack_11e0 - fVar78;
          fVar177 = fStack_11dc - fVar78;
          fVar79 = local_11d8 - fVar78;
          fVar98 = fStack_11d4 - fVar78;
          fVar145 = fStack_11d0 - fVar78;
          fVar78 = fStack_11cc - fVar78;
          fVar138 = fVar79 - fVar163;
          fVar146 = fVar98 - fVar143;
          fVar151 = fVar145 - fStack_1350;
          fVar152 = fVar78 - fStack_134c;
          fVar175 = fStack_1404 - fVar170;
          fVar179 = fVar161 - fVar155;
          fStack_11e0 = fVar162 - fVar156;
          fStack_11dc = fVar158 - fVar157;
          fVar180 = local_1338 - local_11c8;
          fVar184 = fStack_1334 - fStack_11c4;
          fStack_11d0 = fStack_1330 - fStack_11c0;
          fStack_11cc = fStack_132c - fStack_11bc;
          fVar105 = local_1378 - fStack_1404;
          fVar76 = fStack_1374 - fVar161;
          fStack_1420 = fStack_1370 - fVar162;
          fStack_141c = fStack_136c - fVar158;
          fVar135 = local_1368 - local_1338;
          fVar77 = fStack_1364 - fStack_1334;
          fVar75 = fStack_1360 - fStack_1330;
          fVar95 = fStack_135c - fStack_132c;
          _local_11d8 = CONCAT44(fVar184,fVar180);
          fVar124 = fVar163 - fVar183;
          fVar125 = fVar143 - fVar185;
          fVar142 = fStack_1350 - fVar186;
          fVar144 = fStack_134c - fVar177;
          local_11e8 = CONCAT44(fVar179,fVar175);
          fVar43 = fVar170 - local_1378;
          fVar42 = fVar155 - fStack_1374;
          fVar176 = fVar156 - fStack_1370;
          fVar97 = fVar157 - fStack_136c;
          fVar153 = local_11c8 - local_1368;
          fVar178 = fStack_11c4 - fStack_1364;
          fVar166 = fStack_11c0 - fStack_1360;
          fVar168 = fStack_11bc - fStack_135c;
          fVar164 = (fVar175 * (local_1338 + local_11c8) - (fStack_1404 + fVar170) * fVar180) *
                    fVar116 + ((fVar79 + fVar163) * fVar180 - (local_1338 + local_11c8) * fVar138) *
                              local_1468 +
                              (fVar138 * (fStack_1404 + fVar170) - (fVar79 + fVar163) * fVar175) *
                              fStack_1454;
          fVar167 = (fVar179 * (fStack_1334 + fStack_11c4) - (fVar161 + fVar155) * fVar184) *
                    fVar116 + ((fVar98 + fVar143) * fVar184 - (fStack_1334 + fStack_11c4) * fVar146)
                              * fStack_1464 +
                              (fVar146 * (fVar161 + fVar155) - (fVar98 + fVar143) * fVar179) *
                              fStack_1454;
          tNear.field_0._0_8_ = CONCAT44(fVar167,fVar164);
          tNear.field_0.v[2] =
               (fStack_11e0 * (fStack_1330 + fStack_11c0) - (fVar162 + fVar156) * fStack_11d0) *
               fVar116 + ((fVar145 + fStack_1350) * fStack_11d0 -
                         (fStack_1330 + fStack_11c0) * fVar151) * fStack_1460 +
                         (fVar151 * (fVar162 + fVar156) - (fVar145 + fStack_1350) * fStack_11e0) *
                         fStack_1454;
          tNear.field_0.v[3] =
               (fStack_11dc * (fStack_132c + fStack_11bc) - (fVar158 + fVar157) * fStack_11cc) *
               fVar116 + ((fVar78 + fStack_134c) * fStack_11cc -
                         (fStack_132c + fStack_11bc) * fVar152) * fStack_145c +
                         (fVar152 * (fVar158 + fVar157) - (fVar78 + fStack_134c) * fStack_11dc) *
                         fStack_1454;
          fVar161 = fVar183 - fVar79;
          fVar162 = fVar185 - fVar98;
          fVar117 = fVar186 - fVar145;
          fVar123 = fVar177 - fVar78;
          fVar169 = (fVar43 * (local_1368 + local_11c8) - (local_1378 + fVar170) * fVar153) *
                    fVar116 + ((fVar163 + fVar183) * fVar153 - (local_1368 + local_11c8) * fVar124)
                              * local_1468 +
                              (fVar124 * (local_1378 + fVar170) - (fVar163 + fVar183) * fVar43) *
                              fStack_1454;
          fVar171 = (fVar42 * (fStack_1364 + fStack_11c4) - (fStack_1374 + fVar155) * fVar178) *
                    fVar116 + ((fVar143 + fVar185) * fVar178 - (fStack_1364 + fStack_11c4) * fVar125
                              ) * fStack_1464 +
                              (fVar125 * (fStack_1374 + fVar155) - (fVar143 + fVar185) * fVar42) *
                              fStack_1454;
          fVar173 = (fVar176 * (fStack_1360 + fStack_11c0) - (fStack_1370 + fVar156) * fVar166) *
                    fVar116 + ((fStack_1350 + fVar186) * fVar166 -
                              (fStack_1360 + fStack_11c0) * fVar142) * fStack_1460 +
                              (fVar142 * (fStack_1370 + fVar156) - (fStack_1350 + fVar186) * fVar176
                              ) * fStack_1454;
          fVar174 = (fVar97 * (fStack_135c + fStack_11bc) - (fStack_136c + fVar157) * fVar168) *
                    fVar116 + ((fStack_134c + fVar177) * fVar168 -
                              (fStack_135c + fStack_11bc) * fVar144) * fStack_145c +
                              (fVar144 * (fStack_136c + fVar157) - (fStack_134c + fVar177) * fVar97)
                              * fStack_1454;
          auVar65._0_4_ =
               (fVar105 * local_1318 - local_1328 * fVar135) * fVar116 +
               ((fVar79 + fVar183) * fVar135 - local_1318 * fVar161) * local_1468 +
               (fVar161 * local_1328 - (fVar79 + fVar183) * fVar105) * fStack_1454;
          auVar65._4_4_ =
               (fVar76 * fStack_1314 - fStack_1324 * fVar77) * fVar116 +
               ((fVar98 + fVar185) * fVar77 - fStack_1314 * fVar162) * fStack_1464 +
               (fVar162 * fStack_1324 - (fVar98 + fVar185) * fVar76) * fStack_1454;
          auVar65._8_4_ =
               (fStack_1420 * fStack_1310 - fStack_1320 * fVar75) * fVar116 +
               ((fVar145 + fVar186) * fVar75 - fStack_1310 * fVar117) * fStack_1460 +
               (fVar117 * fStack_1320 - (fVar145 + fVar186) * fStack_1420) * fStack_1454;
          auVar65._12_4_ =
               (fStack_141c * fStack_130c - fStack_131c * fVar95) * fVar116 +
               ((fVar78 + fVar177) * fVar95 - fStack_130c * fVar123) * fStack_145c +
               (fVar123 * fStack_131c - (fVar78 + fVar177) * fStack_141c) * fStack_1454;
          fVar145 = fVar164 + fVar169 + auVar65._0_4_;
          fVar183 = fVar167 + fVar171 + auVar65._4_4_;
          fVar185 = tNear.field_0.v[2] + fVar173 + auVar65._8_4_;
          fVar186 = tNear.field_0.v[3] + fVar174 + auVar65._12_4_;
          auVar88._8_4_ = tNear.field_0.i[2];
          auVar88._0_8_ = tNear.field_0._0_8_;
          auVar88._12_4_ = tNear.field_0.i[3];
          auVar19._4_4_ = fVar171;
          auVar19._0_4_ = fVar169;
          auVar19._8_4_ = fVar173;
          auVar19._12_4_ = fVar174;
          auVar54 = minps(auVar88,auVar19);
          auVar54 = minps(auVar54,auVar65);
          auVar132._8_4_ = tNear.field_0.i[2];
          auVar132._0_8_ = tNear.field_0._0_8_;
          auVar132._12_4_ = tNear.field_0.i[3];
          auVar20._4_4_ = fVar171;
          auVar20._0_4_ = fVar169;
          auVar20._8_4_ = fVar173;
          auVar20._12_4_ = fVar174;
          auVar130 = maxps(auVar132,auVar20);
          auVar130 = maxps(auVar130,auVar65);
          fVar78 = ABS(fVar145) * 1.1920929e-07;
          fVar158 = ABS(fVar183) * 1.1920929e-07;
          fVar79 = ABS(fVar185) * 1.1920929e-07;
          fVar98 = ABS(fVar186) * 1.1920929e-07;
          auVar133._4_4_ = -(uint)(auVar130._4_4_ <= fVar158);
          auVar133._0_4_ = -(uint)(auVar130._0_4_ <= fVar78);
          auVar133._8_4_ = -(uint)(auVar130._8_4_ <= fVar79);
          auVar133._12_4_ = -(uint)(auVar130._12_4_ <= fVar98);
          auVar89._4_4_ = -(uint)(-fVar158 <= auVar54._4_4_);
          auVar89._0_4_ = -(uint)(-fVar78 <= auVar54._0_4_);
          auVar89._8_4_ = -(uint)(-fVar79 <= auVar54._8_4_);
          auVar89._12_4_ = -(uint)(-fVar98 <= auVar54._12_4_);
          auVar133 = auVar133 | auVar89;
          iVar27 = movmskps(uVar34,auVar133);
          if (iVar27 != 0) {
            auVar154._0_4_ = fVar43 * fVar135 - fVar105 * fVar153;
            auVar154._4_4_ = fVar42 * fVar77 - fVar76 * fVar178;
            auVar154._8_4_ = fVar176 * fVar75 - fStack_1420 * fVar166;
            auVar154._12_4_ = fVar97 * fVar95 - fStack_141c * fVar168;
            auVar66._4_4_ = -(uint)(ABS(fVar42 * fVar184) < ABS(fVar76 * fVar178));
            auVar66._0_4_ = -(uint)(ABS(fVar43 * fVar180) < ABS(fVar105 * fVar153));
            auVar66._8_4_ = -(uint)(ABS(fVar176 * fStack_11d0) < ABS(fStack_1420 * fVar166));
            auVar66._12_4_ = -(uint)(ABS(fVar97 * fStack_11cc) < ABS(fStack_141c * fVar168));
            auVar21._4_4_ = fVar179 * fVar178 - fVar42 * fVar184;
            auVar21._0_4_ = fVar175 * fVar153 - fVar43 * fVar180;
            auVar21._8_4_ = fStack_11e0 * fVar166 - fVar176 * fStack_11d0;
            auVar21._12_4_ = fStack_11dc * fVar168 - fVar97 * fStack_11cc;
            local_1258 = blendvps(auVar154,auVar21,auVar66);
            auVar182._0_4_ = fVar180 * fVar124 - fVar138 * fVar153;
            auVar182._4_4_ = fVar184 * fVar125 - fVar146 * fVar178;
            auVar182._8_4_ = fStack_11d0 * fVar142 - fVar151 * fVar166;
            auVar182._12_4_ = fStack_11cc * fVar144 - fVar152 * fVar168;
            auVar113._0_4_ = fVar161 * fVar153 - fVar124 * fVar135;
            auVar113._4_4_ = fVar162 * fVar178 - fVar125 * fVar77;
            auVar113._8_4_ = fVar117 * fVar166 - fVar142 * fVar75;
            auVar113._12_4_ = fVar123 * fVar168 - fVar144 * fVar95;
            auVar67._4_4_ = -(uint)(ABS(fVar146 * fVar178) < ABS(fVar125 * fVar77));
            auVar67._0_4_ = -(uint)(ABS(fVar138 * fVar153) < ABS(fVar124 * fVar135));
            auVar67._8_4_ = -(uint)(ABS(fVar151 * fVar166) < ABS(fVar142 * fVar75));
            auVar67._12_4_ = -(uint)(ABS(fVar152 * fVar168) < ABS(fVar144 * fVar95));
            local_1248 = blendvps(auVar113,auVar182,auVar67);
            auVar122._0_4_ = fVar124 * fVar105 - fVar161 * fVar43;
            auVar122._4_4_ = fVar125 * fVar76 - fVar162 * fVar42;
            auVar122._8_4_ = fVar142 * fStack_1420 - fVar117 * fVar176;
            auVar122._12_4_ = fVar144 * fStack_141c - fVar123 * fVar97;
            auVar68._4_4_ = -(uint)(ABS(fVar125 * fVar179) < ABS(fVar162 * fVar42));
            auVar68._0_4_ = -(uint)(ABS(fVar124 * fVar175) < ABS(fVar161 * fVar43));
            auVar68._8_4_ = -(uint)(ABS(fVar142 * fStack_11e0) < ABS(fVar117 * fVar176));
            auVar68._12_4_ = -(uint)(ABS(fVar144 * fStack_11dc) < ABS(fVar123 * fVar97));
            auVar23._4_4_ = fVar146 * fVar42 - fVar125 * fVar179;
            auVar23._0_4_ = fVar138 * fVar43 - fVar124 * fVar175;
            auVar23._8_4_ = fVar151 * fVar176 - fVar142 * fStack_11e0;
            auVar23._12_4_ = fVar152 * fVar97 - fVar144 * fStack_11dc;
            local_1238 = blendvps(auVar122,auVar23,auVar68);
            fVar78 = fVar116 * local_1258._0_4_ +
                     local_1468 * local_1248._0_4_ + fStack_1454 * local_1238._0_4_;
            fVar105 = fVar116 * local_1258._4_4_ +
                      fStack_1464 * local_1248._4_4_ + fStack_1454 * local_1238._4_4_;
            fVar158 = fVar116 * local_1258._8_4_ +
                      fStack_1460 * local_1248._8_4_ + fStack_1454 * local_1238._8_4_;
            fVar116 = fVar116 * local_1258._12_4_ +
                      fStack_145c * local_1248._12_4_ + fStack_1454 * local_1238._12_4_;
            auVar149._0_4_ = fVar78 + fVar78;
            auVar149._4_4_ = fVar105 + fVar105;
            auVar149._8_4_ = fVar158 + fVar158;
            auVar149._12_4_ = fVar116 + fVar116;
            auVar69._0_4_ = fVar170 * local_1248._0_4_ + local_11c8 * local_1238._0_4_;
            auVar69._4_4_ = fVar155 * local_1248._4_4_ + fStack_11c4 * local_1238._4_4_;
            auVar69._8_4_ = fVar156 * local_1248._8_4_ + fStack_11c0 * local_1238._8_4_;
            auVar69._12_4_ = fVar157 * local_1248._12_4_ + fStack_11bc * local_1238._12_4_;
            fVar163 = fVar163 * local_1258._0_4_ + auVar69._0_4_;
            fVar170 = fVar143 * local_1258._4_4_ + auVar69._4_4_;
            fVar135 = fStack_1350 * local_1258._8_4_ + auVar69._8_4_;
            fVar143 = fStack_134c * local_1258._12_4_ + auVar69._12_4_;
            auVar54 = rcpps(auVar69,auVar149);
            fVar78 = auVar54._0_4_;
            fVar105 = auVar54._4_4_;
            fVar116 = auVar54._8_4_;
            fVar158 = auVar54._12_4_;
            auVar141._0_4_ =
                 ((1.0 - auVar149._0_4_ * fVar78) * fVar78 + fVar78) * (fVar163 + fVar163);
            auVar141._4_4_ =
                 ((1.0 - auVar149._4_4_ * fVar105) * fVar105 + fVar105) * (fVar170 + fVar170);
            auVar141._8_4_ =
                 ((1.0 - auVar149._8_4_ * fVar116) * fVar116 + fVar116) * (fVar135 + fVar135);
            auVar141._12_4_ =
                 ((1.0 - auVar149._12_4_ * fVar158) * fVar158 + fVar158) * (fVar143 + fVar143);
            fVar105 = *(float *)(ray + k * 4 + 0x80);
            fVar78 = *(float *)(ray + k * 4 + 0x30);
            auVar90._0_4_ =
                 -(uint)(auVar141._0_4_ <= fVar105 && fVar78 <= auVar141._0_4_) & auVar133._0_4_;
            auVar90._4_4_ =
                 -(uint)(auVar141._4_4_ <= fVar105 && fVar78 <= auVar141._4_4_) & auVar133._4_4_;
            auVar90._8_4_ =
                 -(uint)(auVar141._8_4_ <= fVar105 && fVar78 <= auVar141._8_4_) & auVar133._8_4_;
            auVar90._12_4_ =
                 -(uint)(auVar141._12_4_ <= fVar105 && fVar78 <= auVar141._12_4_) & auVar133._12_4_;
            iVar27 = movmskps(iVar27,auVar90);
            if (iVar27 != 0) {
              uVar34 = auVar90._0_4_ & -(uint)(auVar149._0_4_ != 0.0);
              uVar80 = auVar90._4_4_ & -(uint)(auVar149._4_4_ != 0.0);
              valid.field_0._0_8_ = CONCAT44(uVar80,uVar34);
              valid.field_0.i[2] = auVar90._8_4_ & -(uint)(auVar149._8_4_ != 0.0);
              valid.field_0.i[3] = auVar90._12_4_ & -(uint)(auVar149._12_4_ != 0.0);
              iVar27 = movmskps(iVar27,(undefined1  [16])valid.field_0);
              if (iVar27 != 0) {
                auVar24._4_4_ = fVar183;
                auVar24._0_4_ = fVar145;
                auVar24._8_4_ = fVar185;
                auVar24._12_4_ = fVar186;
                local_1268 = auVar141;
                local_1228._8_8_ = uStack_1060;
                local_1228._0_8_ = local_1068;
                pSVar38 = context->scene;
                auVar54 = rcpps(auVar133,auVar24);
                fVar116 = auVar54._0_4_;
                fVar158 = auVar54._4_4_;
                fVar163 = auVar54._8_4_;
                fVar170 = auVar54._12_4_;
                fVar135 = (float)DAT_01f7ba10;
                fVar143 = DAT_01f7ba10._4_4_;
                fVar155 = DAT_01f7ba10._12_4_;
                fVar78 = DAT_01f7ba10._8_4_;
                fVar116 = (float)(-(uint)(1e-18 <= ABS(fVar145)) &
                                 (uint)((fVar135 - fVar145 * fVar116) * fVar116 + fVar116));
                fVar158 = (float)(-(uint)(1e-18 <= ABS(fVar183)) &
                                 (uint)((fVar143 - fVar183 * fVar158) * fVar158 + fVar158));
                fVar163 = (float)(-(uint)(1e-18 <= ABS(fVar185)) &
                                 (uint)((fVar78 - fVar185 * fVar163) * fVar163 + fVar163));
                fVar170 = (float)(-(uint)(1e-18 <= ABS(fVar186)) &
                                 (uint)((fVar155 - fVar186 * fVar170) * fVar170 + fVar170));
                auVar150._0_4_ = fVar164 * fVar116;
                auVar150._4_4_ = fVar167 * fVar158;
                auVar150._8_4_ = tNear.field_0.v[2] * fVar163;
                auVar150._12_4_ = tNear.field_0.v[3] * fVar170;
                auVar54 = minps(auVar150,_DAT_01f7ba10);
                auVar160._0_4_ = fVar116 * fVar169;
                auVar160._4_4_ = fVar158 * fVar171;
                auVar160._8_4_ = fVar163 * fVar173;
                auVar160._12_4_ = fVar170 * fVar174;
                auVar130 = minps(auVar160,_DAT_01f7ba10);
                auVar104._0_4_ = fVar135 - auVar54._0_4_;
                auVar104._4_4_ = fVar143 - auVar54._4_4_;
                auVar104._8_4_ = fVar78 - auVar54._8_4_;
                auVar104._12_4_ = fVar155 - auVar54._12_4_;
                auVar134._0_4_ = fVar135 - auVar130._0_4_;
                auVar134._4_4_ = fVar143 - auVar130._4_4_;
                auVar134._8_4_ = fVar78 - auVar130._8_4_;
                auVar134._12_4_ = fVar155 - auVar130._12_4_;
                local_1288 = blendvps(auVar54,auVar104,local_1228);
                local_1278 = blendvps(auVar130,auVar134,local_1228);
                auVar70._8_4_ = valid.field_0.i[2];
                auVar70._0_8_ = valid.field_0._0_8_;
                auVar70._12_4_ = valid.field_0.i[3];
                auVar130 = blendvps(_DAT_01f7a9f0,auVar141,auVar70);
                auVar114._4_4_ = auVar130._0_4_;
                auVar114._0_4_ = auVar130._4_4_;
                auVar114._8_4_ = auVar130._12_4_;
                auVar114._12_4_ = auVar130._8_4_;
                auVar54 = minps(auVar114,auVar130);
                auVar71._0_8_ = auVar54._8_8_;
                auVar71._8_4_ = auVar54._0_4_;
                auVar71._12_4_ = auVar54._4_4_;
                auVar54 = minps(auVar71,auVar54);
                auVar72._0_8_ =
                     CONCAT44(-(uint)(auVar54._4_4_ == auVar130._4_4_) & uVar80,
                              -(uint)(auVar54._0_4_ == auVar130._0_4_) & uVar34);
                auVar72._8_4_ = -(uint)(auVar54._8_4_ == auVar130._8_4_) & valid.field_0.i[2];
                auVar72._12_4_ = -(uint)(auVar54._12_4_ == auVar130._12_4_) & valid.field_0.i[3];
                iVar27 = movmskps(iVar27,auVar72);
                aVar91 = valid.field_0;
                if (iVar27 != 0) {
                  aVar91.i[2] = auVar72._8_4_;
                  aVar91._0_8_ = auVar72._0_8_;
                  aVar91.i[3] = auVar72._12_4_;
                }
                uVar28 = movmskps(iVar27,(undefined1  [16])aVar91);
                lVar40 = 0;
                if (CONCAT44(uVar29,uVar28) != 0) {
                  for (; (CONCAT44(uVar29,uVar28) >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                  }
                }
LAB_0027b238:
                uVar34 = puVar39[lVar40];
                pRVar32 = (RTCRayN *)(ulong)uVar34;
                pGVar18 = (pSVar38->geometries).items[(long)pRVar32].ptr;
                if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  valid.field_0.v[lVar40] = 0.0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar29 = *(undefined4 *)(local_1288 + lVar40 * 4);
                    uVar28 = *(undefined4 *)(local_1278 + lVar40 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1268 + lVar40 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1258 + lVar40 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1248 + lVar40 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1238 + lVar40 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar29;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar28;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)(lVar31 + 0x50 + lVar40 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar34;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_0027b6ef;
                  }
                  local_1148 = *(undefined4 *)(local_1288 + lVar40 * 4);
                  local_1138 = *(undefined4 *)(local_1278 + lVar40 * 4);
                  uVar29 = *(undefined4 *)(local_1258 + lVar40 * 4);
                  uVar28 = *(undefined4 *)(local_1248 + lVar40 * 4);
                  local_1118._4_4_ = uVar34;
                  local_1118._0_4_ = uVar34;
                  local_1118._8_4_ = uVar34;
                  local_1118._12_4_ = uVar34;
                  uVar10 = *(undefined4 *)(lVar31 + 0x50 + lVar40 * 4);
                  local_1128._4_4_ = uVar10;
                  local_1128._0_4_ = uVar10;
                  local_1128._8_4_ = uVar10;
                  local_1128._12_4_ = uVar10;
                  local_1178._4_4_ = uVar29;
                  local_1178._0_4_ = uVar29;
                  local_1178._8_4_ = uVar29;
                  local_1178._12_4_ = uVar29;
                  local_1168._4_4_ = uVar28;
                  local_1168._0_4_ = uVar28;
                  local_1168._8_4_ = uVar28;
                  local_1168._12_4_ = uVar28;
                  uVar29 = *(undefined4 *)(local_1238 + lVar40 * 4);
                  local_1158._4_4_ = uVar29;
                  local_1158._0_4_ = uVar29;
                  local_1158._8_4_ = uVar29;
                  local_1158._12_4_ = uVar29;
                  uStack_1144 = local_1148;
                  uStack_1140 = local_1148;
                  uStack_113c = local_1148;
                  uStack_1134 = local_1138;
                  uStack_1130 = local_1138;
                  uStack_112c = local_1138;
                  local_1108 = context->user->instID[0];
                  uStack_1104 = local_1108;
                  uStack_1100 = local_1108;
                  uStack_10fc = local_1108;
                  local_10f8 = context->user->instPrimID[0];
                  uStack_10f4 = local_10f8;
                  uStack_10f0 = local_10f8;
                  uStack_10ec = local_10f8;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1268 + lVar40 * 4);
                  local_13d8 = *(undefined1 (*) [16])
                                (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                  args.valid = (int *)local_13d8;
                  args.geometryUserPtr = pGVar18->userPtr;
                  args.context = context->user;
                  args.hit = (RTCHitN *)local_1178;
                  args.N = 4;
                  pRVar32 = (RTCRayN *)pGVar18->intersectionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar32 != (RTCRayN *)0x0) {
                    pRVar32 = (RTCRayN *)(*(code *)pRVar32)(&args);
                  }
                  if (local_13d8 == (undefined1  [16])0x0) {
                    auVar92._8_4_ = 0xffffffff;
                    auVar92._0_8_ = 0xffffffffffffffff;
                    auVar92._12_4_ = 0xffffffff;
                    auVar92 = auVar92 ^ _DAT_01f7ae20;
                  }
                  else {
                    pRVar32 = (RTCRayN *)context->args->filter;
                    if ((pRVar32 != (RTCRayN *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                      pRVar32 = (RTCRayN *)(*(code *)pRVar32)(&args);
                    }
                    auVar73._0_4_ = -(uint)(local_13d8._0_4_ == 0);
                    auVar73._4_4_ = -(uint)(local_13d8._4_4_ == 0);
                    auVar73._8_4_ = -(uint)(local_13d8._8_4_ == 0);
                    auVar73._12_4_ = -(uint)(local_13d8._12_4_ == 0);
                    auVar92 = auVar73 ^ _DAT_01f7ae20;
                    if (local_13d8 != (undefined1  [16])0x0) {
                      auVar54 = blendvps(*(undefined1 (*) [16])args.hit,
                                         *(undefined1 (*) [16])(args.ray + 0xc0),auVar73);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar54;
                      auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                         *(undefined1 (*) [16])(args.ray + 0xd0),auVar73);
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar54;
                      auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                         *(undefined1 (*) [16])(args.ray + 0xe0),auVar73);
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar54;
                      auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                         *(undefined1 (*) [16])(args.ray + 0xf0),auVar73);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar54;
                      auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                         *(undefined1 (*) [16])(args.ray + 0x100),auVar73);
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar54;
                      auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                         *(undefined1 (*) [16])(args.ray + 0x110),auVar73);
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar54;
                      auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                         *(undefined1 (*) [16])(args.ray + 0x120),auVar73);
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar54;
                      auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                         *(undefined1 (*) [16])(args.ray + 0x130),auVar73);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar54;
                      auVar54 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                         *(undefined1 (*) [16])(args.ray + 0x140),auVar73);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar54;
                      pRVar32 = args.ray;
                    }
                  }
                  if ((_DAT_01f7bb20 & auVar92) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar105;
                  }
                  else {
                    fVar105 = *(float *)(ray + k * 4 + 0x80);
                  }
                  valid.field_0.v[lVar40] = 0.0;
                  valid.field_0.i[0] = -(uint)(auVar141._0_4_ <= fVar105) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(auVar141._4_4_ <= fVar105) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(auVar141._8_4_ <= fVar105) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(auVar141._12_4_ <= fVar105) & valid.field_0.i[3];
                }
                iVar27 = movmskps((int)pRVar32,(undefined1  [16])valid.field_0);
                if (iVar27 == 0) goto LAB_0027b6ef;
                auVar130 = blendvps(_DAT_01f7a9f0,auVar141,(undefined1  [16])valid.field_0);
                auVar115._4_4_ = auVar130._0_4_;
                auVar115._0_4_ = auVar130._4_4_;
                auVar115._8_4_ = auVar130._12_4_;
                auVar115._12_4_ = auVar130._8_4_;
                auVar54 = minps(auVar115,auVar130);
                auVar93._0_8_ = auVar54._8_8_;
                auVar93._8_4_ = auVar54._0_4_;
                auVar93._12_4_ = auVar54._4_4_;
                auVar54 = minps(auVar93,auVar54);
                auVar94._0_8_ =
                     CONCAT44(-(uint)(auVar54._4_4_ == auVar130._4_4_) & valid.field_0._4_4_,
                              -(uint)(auVar54._0_4_ == auVar130._0_4_) & valid.field_0._0_4_);
                auVar94._8_4_ = -(uint)(auVar54._8_4_ == auVar130._8_4_) & valid.field_0._8_4_;
                auVar94._12_4_ = -(uint)(auVar54._12_4_ == auVar130._12_4_) & valid.field_0._12_4_;
                iVar27 = movmskps(iVar27,auVar94);
                aVar74 = valid.field_0;
                if (iVar27 != 0) {
                  aVar74.i[2] = auVar94._8_4_;
                  aVar74._0_8_ = auVar94._0_8_;
                  aVar74.i[3] = auVar94._12_4_;
                }
                uVar29 = movmskps(iVar27,(undefined1  [16])aVar74);
                uVar33 = CONCAT44((int)((ulong)pRVar32 >> 0x20),uVar29);
                lVar40 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                  }
                }
                goto LAB_0027b238;
              }
            }
          }
LAB_0027b6ef:
          local_11a8 = local_11a8 + 1;
        } while (local_11a8 != local_11b0);
      }
      uVar29 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar130._4_4_ = uVar29;
      auVar130._0_4_ = uVar29;
      auVar130._8_4_ = uVar29;
      auVar130._12_4_ = uVar29;
      auVar54 = local_1198;
      fVar156 = local_1088;
      fVar76 = fStack_1084;
      fVar157 = fStack_1080;
      fVar105 = fStack_107c;
      fVar77 = local_10d8;
      fVar42 = fStack_10d4;
      fVar75 = fStack_10d0;
      fVar176 = fStack_10cc;
      fVar135 = local_1188;
      fVar143 = fStack_1184;
      fVar155 = fStack_1180;
      fVar43 = fStack_117c;
      fVar79 = local_1078;
      fVar95 = fStack_1074;
      fVar97 = fStack_1070;
      fVar78 = fStack_106c;
      fVar98 = local_1098;
      fVar161 = fStack_1094;
      fVar162 = fStack_1090;
      fVar116 = fStack_108c;
      fVar117 = local_10a8;
      fVar123 = fStack_10a4;
      fVar124 = fStack_10a0;
      fVar158 = fStack_109c;
      fVar125 = local_10b8;
      fVar142 = fStack_10b4;
      fVar144 = fStack_10b0;
      fVar163 = fStack_10ac;
      fVar145 = local_10c8;
      fVar138 = fStack_10c4;
      fVar146 = fStack_10c0;
      fVar170 = fStack_10bc;
      fVar151 = local_10e8;
      fVar152 = fStack_10e4;
      fVar153 = fStack_10e0;
      fVar178 = fStack_10dc;
    }
    if (pSVar30 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }